

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcols.c
# Opt level: O3

int ffgcls(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,int nultyp,
          char *nulval,char **array,char *nularray,int *anynul,int *status)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  short sVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  double *array_00;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  bool bVar16;
  char cform [20];
  uint local_2a4;
  int tstatus;
  int equivtype;
  char dispfmt [20];
  double tscale;
  int hdutype;
  char tmpnull [80];
  char keyname [75];
  char message [81];
  
  tscale = 1.0;
  if (nelem == 0 || 0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar7 = ffrdef(fptr,status), 0 < iVar7))
    goto LAB_001587b5;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
    snprintf(message,0x51,"Specified column number is out of range: %d",(ulong)(uint)colnum);
    ffpmsg(message);
    *status = 0x12e;
    return 0x12e;
  }
  ffeqtyll(fptr,colnum,&equivtype,(LONGLONG *)0x0,(LONGLONG *)0x0,status);
  if (equivtype < 0) {
    equivtype = -equivtype;
  }
  iVar7 = equivtype;
  uVar8 = fptr->Fptr->tableptr[(ulong)(uint)colnum - 1].tdatatype;
  uVar12 = -uVar8;
  if (0 < (int)uVar8) {
    uVar12 = uVar8;
  }
  if ((int)uVar12 < 0x53) {
    if (uVar12 == 0xe) {
      array_00 = (double *)malloc(nelem);
      ffgcll(fptr,colnum,firstrow,firstelem,nelem,nultyp,*nulval,(char *)array_00,nularray,anynul,
             status);
      if (0 < nelem && *status < 1) {
        lVar14 = 0;
        do {
          sVar4 = (ushort)(*(char *)((long)array_00 + lVar14) != '\0') * 8 + 0x46;
          if (*(char *)((long)array_00 + lVar14) == '\x01') {
            sVar4 = 0x54;
          }
          *(short *)array[lVar14] = sVar4;
          lVar14 = lVar14 + 1;
        } while (nelem != lVar14);
      }
    }
    else {
      if (uVar12 == 0x10) {
        ffgcls2(fptr,colnum,firstrow,firstelem,nelem,nultyp,nulval,array,nularray,anynul,status);
        goto LAB_001587b5;
      }
LAB_00157f36:
      if (equivtype == 0x51 && (uVar12 ^ 0x51) == 0) {
        array_00 = (double *)calloc(nelem,8);
        pcVar9 = (char *)calloc(nelem,1);
        iVar7 = ffgcfjj(fptr,colnum,firstrow,firstelem,nelem,(LONGLONG *)array_00,pcVar9,anynul,
                        status);
        if (iVar7 < 1) {
          if (nulval == (char *)0x0) {
            tmpnull[0] = ' ';
            tmpnull[1] = '\0';
            bVar3 = false;
          }
          else {
            strncpy(tmpnull,nulval,0x4f);
            tmpnull[0x4f] = '\0';
            sVar10 = strlen(tmpnull);
            bVar3 = 0x14 < (int)sVar10;
          }
          if (0 < nelem) {
            lVar14 = 0;
            do {
              if (pcVar9[lVar14] == '\0') {
                snprintf(message,400,"%20lld",array_00[lVar14]);
                *array[lVar14] = '\0';
                strncat(array[lVar14],message,0x14);
              }
              else {
                *array[lVar14] = '\0';
                if (bVar3) {
                  strncat(array[lVar14],tmpnull,0x14);
                }
                else {
                  sprintf(array[lVar14],"%*s",0x14,tmpnull);
                }
                if (nultyp == 2) {
                  nularray[lVar14] = '\x01';
                }
              }
              lVar14 = lVar14 + 1;
            } while (nelem != lVar14);
          }
        }
        free(pcVar9);
      }
      else {
        array_00 = (double *)calloc(nelem,8);
        if ((uVar12 ^ 0x51) == 0 && iVar7 == 0x50) {
          pcVar9 = (char *)calloc(nelem,1);
          iVar7 = ffgcfujj(fptr,colnum,firstrow,firstelem,nelem,(ULONGLONG *)array_00,pcVar9,anynul,
                           status);
          if (iVar7 < 1) {
            if (nulval == (char *)0x0) {
              tmpnull[0] = ' ';
              tmpnull[1] = '\0';
              bVar3 = false;
            }
            else {
              strncpy(tmpnull,nulval,0x4f);
              tmpnull[0x4f] = '\0';
              sVar10 = strlen(tmpnull);
              bVar3 = 0x14 < (int)sVar10;
            }
            if (0 < nelem) {
              lVar14 = 0;
              do {
                if (pcVar9[lVar14] == '\0') {
                  snprintf(message,400,"%20llu",array_00[lVar14]);
                  *array[lVar14] = '\0';
                  strncat(array[lVar14],message,0x14);
                }
                else {
                  *array[lVar14] = '\0';
                  if (bVar3) {
                    strncat(array[lVar14],tmpnull,0x14);
                  }
                  else {
                    sprintf(array[lVar14],"%*s",0x14,tmpnull);
                  }
                  if (nultyp == 2) {
                    nularray[lVar14] = '\x01';
                  }
                }
                lVar14 = lVar14 + 1;
              } while (nelem != lVar14);
            }
            free(pcVar9);
          }
          else {
            free(pcVar9);
          }
        }
        else {
          iVar7 = ffgcld(fptr,colnum,firstrow,firstelem,nelem,1,nultyp,-9.1191291391491e-36,array_00
                         ,nularray,anynul,status);
          if (iVar7 < 1) {
            ffgcdw(fptr,colnum,(int *)&local_2a4,status);
            ffkeyn("TSCAL",colnum,keyname,status);
            tstatus = 0;
            iVar7 = ffgkyd(fptr,keyname,&tscale,(char *)0x0,&tstatus);
            bVar16 = iVar7 != 0;
            bVar3 = tscale == 1.0;
            bVar6 = uVar12 < 0x2a && (bVar3 || bVar16);
            ffkeyn("TDISP",colnum,keyname,status);
            tstatus = 0;
            cform._0_8_ = cform._0_8_ & 0xffffffffffffff00;
            iVar7 = ffgkys(fptr,keyname,dispfmt,(char *)0x0,&tstatus);
            if (iVar7 == 0) {
              ffcdsp(dispfmt,cform);
              uVar8 = (byte)dispfmt[0] - 0x41;
              if (0x39 < uVar8) goto LAB_00158658;
              if ((0x200410002004100U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
                bVar6 = true;
                goto LAB_00158658;
              }
              if ((ulong)uVar8 != 0) goto LAB_00158658;
              cform._0_8_ = cform._0_8_ & 0xffffffffffffff00;
LAB_00158663:
              ffkeyn("TFORM",colnum,keyname,status);
              ffgkys(fptr,keyname,dispfmt,(char *)0x0,status);
              if (0x15 < uVar12 || (bVar3 || bVar16)) {
                if ((uVar12 == 0x29 && (!bVar3 && !bVar16)) ||
                   (uVar12 == 0x51 && (!bVar3 && !bVar16))) {
                  builtin_strncpy(cform,"%#23.15G",9);
                }
                else {
                  ffghdt(fptr,&hdutype,status);
                  if (hdutype == 1) {
                    ffcdsp(dispfmt,cform);
                  }
                  else if (uVar12 == 0x15) {
                    builtin_strncpy(cform,"%6d",4);
                  }
                  else if ((uVar12 == 0xb) || (uVar12 == 1)) {
                    builtin_strncpy(cform,"%4d",4);
                  }
                  else if (uVar12 == 0x29) {
                    builtin_strncpy(cform,"%11.0f",7);
                    uVar5 = cform._0_4_;
                    cform._0_8_ = CONCAT44(cform._4_4_,uVar5);
                    bVar6 = false;
                  }
                  else if (uVar12 == 0x52) {
                    builtin_strncpy(cform,"%#23.15G",9);
                  }
                  else if (uVar12 == 0x2a) {
                    builtin_strncpy(cform,"%#14.6G",8);
                  }
                }
              }
              else {
                builtin_strncpy(cform,"%#14.6G",8);
              }
            }
            else {
LAB_00158658:
              if (cform[0] == '\0') goto LAB_00158663;
            }
            if (nulval == (char *)0x0) {
              tmpnull[0] = ' ';
              tmpnull[1] = '\0';
              iVar7 = 1;
            }
            else {
              strncpy(tmpnull,nulval,0x4f);
              tmpnull[0x4f] = '\0';
              sVar10 = strlen(tmpnull);
              iVar7 = (int)sVar10;
            }
            if (0 < nelem) {
              sVar10 = (size_t)(int)local_2a4;
              lVar14 = 0;
              do {
                if (uVar12 == 1) {
                  dVar2 = array_00[lVar14];
                  lVar13 = 0;
                  do {
                    array[lVar14][lVar13] =
                         (byte)~(byte)(((int)dVar2 & 0xffU) << ((byte)lVar13 & 0x1f)) >> 7 ^ 0x31;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 8);
                  array[lVar14][8] = '\0';
                }
                else {
                  if (nultyp == 2) {
                    if (nularray[lVar14] != '\0') goto LAB_001588df;
                  }
                  else if (((nultyp == 1) && (array_00[lVar14] == -9.1191291391491e-36)) &&
                          (!NAN(array_00[lVar14]))) {
LAB_001588df:
                    *array[lVar14] = '\0';
                    if ((int)local_2a4 < iVar7) {
                      strncat(array[lVar14],tmpnull,sVar10);
                    }
                    else {
                      sprintf(array[lVar14],"%*s",(ulong)local_2a4);
                    }
                    goto LAB_001589d0;
                  }
                  if (bVar6) {
                    snprintf(message,400,cform);
                  }
                  else {
                    snprintf(message,400,cform);
                  }
                  sVar11 = strlen(message);
                  if ((int)local_2a4 < (int)sVar11) {
                    memset(message,0x2a,sVar10);
                  }
                  *array[lVar14] = '\0';
                  strncat(array[lVar14],message,sVar10);
                }
LAB_001589d0:
                lVar14 = lVar14 + 1;
              } while (lVar14 != nelem);
            }
          }
        }
      }
    }
  }
  else if (uVar12 == 0x53) {
    array_00 = (double *)calloc(nelem * 2,4);
    ffgcle(fptr,colnum,firstrow,firstelem * 2 + -1,nelem * 2,1,1,-9.11912e-36,(float *)array_00,
           nularray,anynul,status);
    if (0 < *status) goto LAB_001587b0;
    ffgcdw(fptr,colnum,(int *)&local_2a4,status);
    ffkeyn("TDISP",colnum,keyname,status);
    tstatus = 0;
    cform._0_8_ = cform._0_8_ & 0xffffffffffffff00;
    iVar7 = ffgkys(fptr,keyname,dispfmt,(char *)0x0,&tstatus);
    bVar3 = true;
    if (iVar7 == 0) {
      ffcdsp(dispfmt,cform);
      bVar6 = true;
      uVar8 = (byte)dispfmt[0] - 0x41;
      bVar3 = true;
      if (0x39 < uVar8) goto LAB_00158190;
      if ((0x200410002004100U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
        bVar3 = false;
        goto LAB_00158190;
      }
      if ((ulong)uVar8 != 0) goto LAB_00158190;
LAB_00158197:
      builtin_strncpy(cform,"%14.6E",7);
      uVar5 = cform._0_4_;
      cform._0_8_ = CONCAT44(cform._4_4_,uVar5);
    }
    else {
LAB_00158190:
      bVar6 = bVar3;
      if (cform[0] == '\0') goto LAB_00158197;
    }
    if (0 < nelem) {
      sVar10 = (size_t)((int)((local_2a4 - ((int)(local_2a4 - 3) >> 0x1f)) + -3) >> 1);
      lVar14 = 0;
      do {
        pcVar9 = array[lVar14];
        pcVar9[0] = '(';
        pcVar9[1] = '\0';
        fVar1 = *(float *)(array_00 + lVar14);
        if ((fVar1 != -9.11912e-36) || (NAN(fVar1))) {
          if (bVar6) {
            snprintf(message,400,cform,(double)fVar1);
          }
          else {
            snprintf(message,400,cform,(ulong)(uint)(int)fVar1);
          }
        }
        else {
          builtin_strncpy(message,"NULL",5);
          if (nultyp == 2) {
            nularray[lVar14] = '\x01';
          }
        }
        strncat(array[lVar14],message,sVar10);
        pcVar9 = array[lVar14];
        sVar11 = strlen(pcVar9);
        pcVar9 = pcVar9 + sVar11;
        pcVar9[0] = ',';
        pcVar9[1] = '\0';
        fVar1 = *(float *)((long)array_00 + lVar14 * 8 + 4);
        if ((fVar1 != -9.11912e-36) || (NAN(fVar1))) {
          if (bVar6) {
            snprintf(message,400,cform,(double)fVar1);
          }
          else {
            snprintf(message,400,cform,(ulong)(uint)(int)fVar1);
          }
        }
        else {
          builtin_strncpy(message,"NULL",5);
          if (nultyp == 2) {
            nularray[lVar14] = '\x01';
          }
        }
        strncat(array[lVar14],message,sVar10);
        pcVar9 = array[lVar14];
        sVar11 = strlen(pcVar9);
        pcVar9 = pcVar9 + sVar11;
        pcVar9[0] = ')';
        pcVar9[1] = '\0';
        lVar14 = lVar14 + 1;
      } while (nelem != lVar14);
    }
  }
  else {
    if (uVar12 != 0xa3) goto LAB_00157f36;
    array_00 = (double *)calloc(nelem * 2,8);
    ffgcld(fptr,colnum,firstrow,firstelem * 2 + -1,nelem * 2,1,1,-9.1191291391491e-36,array_00,
           nularray,anynul,status);
    if (0 < *status) goto LAB_001587b0;
    ffgcdw(fptr,colnum,(int *)&local_2a4,status);
    ffkeyn("TDISP",colnum,keyname,status);
    tstatus = 0;
    cform._0_8_ = cform._0_8_ & 0xffffffffffffff00;
    iVar7 = ffgkys(fptr,keyname,dispfmt,(char *)0x0,&tstatus);
    bVar3 = true;
    if (iVar7 == 0) {
      ffcdsp(dispfmt,cform);
      bVar6 = true;
      uVar8 = (byte)dispfmt[0] - 0x41;
      bVar3 = true;
      if (0x39 < uVar8) goto LAB_00157d7b;
      if ((0x200410002004100U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
        bVar3 = false;
        goto LAB_00157d7b;
      }
      if ((ulong)uVar8 != 0) goto LAB_00157d7b;
LAB_00157d82:
      builtin_strncpy(cform,"%23.15E",8);
    }
    else {
LAB_00157d7b:
      bVar6 = bVar3;
      if (cform[0] == '\0') goto LAB_00157d82;
    }
    if (0 < nelem) {
      sVar10 = (size_t)((int)((local_2a4 - ((int)(local_2a4 - 3) >> 0x1f)) + -3) >> 1);
      pdVar15 = array_00 + 1;
      lVar14 = 0;
      do {
        pcVar9 = array[lVar14];
        pcVar9[0] = '(';
        pcVar9[1] = '\0';
        dVar2 = pdVar15[-1];
        if ((dVar2 != -9.1191291391491e-36) || (NAN(dVar2))) {
          if (bVar6) {
            snprintf(message,400,cform);
          }
          else {
            snprintf(message,400,cform,(ulong)(uint)(int)dVar2);
          }
        }
        else {
          builtin_strncpy(message,"NULL",5);
          if (nultyp == 2) {
            nularray[lVar14] = '\x01';
          }
        }
        strncat(array[lVar14],message,sVar10);
        pcVar9 = array[lVar14];
        sVar11 = strlen(pcVar9);
        pcVar9 = pcVar9 + sVar11;
        pcVar9[0] = ',';
        pcVar9[1] = '\0';
        dVar2 = *pdVar15;
        if ((dVar2 != -9.1191291391491e-36) || (NAN(dVar2))) {
          if (bVar6) {
            snprintf(message,400,cform);
          }
          else {
            snprintf(message,400,cform,(ulong)(uint)(int)dVar2);
          }
        }
        else {
          builtin_strncpy(message,"NULL",5);
          if (nultyp == 2) {
            nularray[lVar14] = '\x01';
          }
        }
        strncat(array[lVar14],message,sVar10);
        pcVar9 = array[lVar14];
        sVar11 = strlen(pcVar9);
        pcVar9 = pcVar9 + sVar11;
        pcVar9[0] = ')';
        pcVar9[1] = '\0';
        lVar14 = lVar14 + 1;
        pdVar15 = pdVar15 + 2;
      } while (nelem != lVar14);
    }
  }
LAB_001587b0:
  free(array_00);
LAB_001587b5:
  return *status;
}

Assistant:

int ffgcls( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col) */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)        */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st) */
            LONGLONG  nelem,      /* I - number of strings to read              */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            char  *nulval,    /* I - value for null pixels if nultyp = 1     */
            char **array,     /* O - array of values that are read           */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of string values from a column in the current FITS HDU.
  Returns a formated string value, regardless of the datatype of the column
*/
{
    int tcode, hdutype, tstatus, scaled, intcol, dwidth, nulwidth, ll, dlen;
    int equivtype;
    long ii, jj;
    tcolumn *colptr;
    char message[FLEN_ERRMSG], *carray, keyname[FLEN_KEYWORD];
    char cform[20], dispfmt[20], tmpstr[400], *flgarray, tmpnull[80];
    unsigned char byteval;
    float *earray;
    double *darray, tscale = 1.0;
    LONGLONG *llarray;
    ULONGLONG *ullarray;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        return(*status = BAD_COL_NUM);
    }

    /* get equivalent dataype of column (only needed for TLONGLONG columns) */
    ffeqtyll(fptr, colnum, &equivtype, NULL, NULL, status);
    if (equivtype < 0) equivtype = abs(equivtype);
    
    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    tcode = abs(colptr->tdatatype);

    intcol = 0;
    if (tcode == TSTRING)
    {
      /* simply call the string column reading routine */
      ffgcls2(fptr, colnum, firstrow, firstelem, nelem, nultyp, nulval,
           array, nularray, anynul, status);
    }
    else if (tcode == TLOGICAL)
    {
      /* allocate memory for the array of logical values */
      carray = (char *) malloc((size_t) nelem);

      /*  call the logical column reading routine */
      ffgcll(fptr, colnum, firstrow, firstelem, nelem, nultyp, *nulval,
           carray, nularray, anynul, status); 

      if (*status <= 0)
      {
         /* convert logical values to "T", "F", or "N" (Null) */
         for (ii = 0; ii < nelem; ii++)
         {
           if (carray[ii] == 1)
              strcpy(array[ii], "T");
           else if (carray[ii] == 0)
              strcpy(array[ii], "F");
           else  /* undefined values = 2 */
              strcpy(array[ii],"N");
         }
      }

      free(carray);  /* free the memory */
    }
    else if (tcode == TCOMPLEX)
    {
      /* allocate memory for the array of double values */
      earray = (float *) calloc((size_t) (nelem * 2), sizeof(float) );
      
      ffgcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
        1, 1, FLOATNULLVALUE, earray, nularray, anynul, status);

      if (*status <= 0)
      {

         /* determine the format for the output strings */

         ffgcdw(fptr, colnum, &dwidth, status);
         dwidth = (dwidth - 3) / 2;
 
         /* use the TDISPn keyword if it exists */
         ffkeyn("TDISP", colnum, keyname, status);
         tstatus = 0;
         cform[0] = '\0';

         if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
         {
             /* convert the Fortran style format to a C style format */
             ffcdsp(dispfmt, cform);

	     /* Special case: TDISPn='Aw' disallowed for numeric types */
	     if (dispfmt[0] == 'A') {
	       cform[0] = 0;

	       /* Special case: if the output is intended to be represented
		  as an integer, but we read it as a double, we need to
		  set intcol = 1 so it is printed as an integer */
	     } else if ((dispfmt[0] == 'I') || (dispfmt[0] == 'i') ||
			(dispfmt[0] == 'O') || (dispfmt[0] == 'o') ||
			(dispfmt[0] == 'Z') || (dispfmt[0] == 'z')) {
	       intcol = 1;
	     }
         }

         if (!cform[0])
             strcpy(cform, "%14.6E");

         /* write the formated string for each value:  "(real,imag)" */
         jj = 0;
         for (ii = 0; ii < nelem; ii++)
         {
           strcpy(array[ii], "(");

           /* test for null value */
           if (earray[jj] == FLOATNULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) earray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, earray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ",");
           jj++;

           /* test for null value */
           if (earray[jj] == FLOATNULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) earray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, earray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ")");
           jj++;
         }
      }

      free(earray);  /* free the memory */
    }
    else if (tcode == TDBLCOMPLEX)
    {
      /* allocate memory for the array of double values */
      darray = (double *) calloc((size_t) (nelem * 2), sizeof(double) );
      
      ffgcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
        1, 1, DOUBLENULLVALUE, darray, nularray, anynul, status);

      if (*status <= 0)
      {
         /* determine the format for the output strings */

         ffgcdw(fptr, colnum, &dwidth, status);
         dwidth = (dwidth - 3) / 2;

         /* use the TDISPn keyword if it exists */
         ffkeyn("TDISP", colnum, keyname, status);
         tstatus = 0;
         cform[0] = '\0';
 
         if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
         {
             /* convert the Fortran style format to a C style format */
             ffcdsp(dispfmt, cform);

	     /* Special case: TDISPn='Aw' disallowed for numeric types */
	     if (dispfmt[0] == 'A') {
	       cform[0] = 0;

	       /* Special case: if the output is intended to be represented
		  as an integer, but we read it as a double, we need to
		  set intcol = 1 so it is printed as an integer */
	     } else if ((dispfmt[0] == 'I') || (dispfmt[0] == 'i') ||
			(dispfmt[0] == 'O') || (dispfmt[0] == 'o') ||
			(dispfmt[0] == 'Z') || (dispfmt[0] == 'z')) {
	       intcol = 1;
	     }
         }

         if (!cform[0])
            strcpy(cform, "%23.15E");

         /* write the formated string for each value:  "(real,imag)" */
         jj = 0;
         for (ii = 0; ii < nelem; ii++)
         {
           strcpy(array[ii], "(");

           /* test for null value */
           if (darray[jj] == DOUBLENULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) darray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, darray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ",");
           jj++;

           /* test for null value */
           if (darray[jj] == DOUBLENULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) darray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, darray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ")");
           jj++;
         }
      }

      free(darray);  /* free the memory */
    }
    else if (tcode == TLONGLONG && equivtype == TLONGLONG)
    {
      /* allocate memory for the array of LONGLONG values */
      llarray = (LONGLONG *) calloc((size_t) nelem, sizeof(LONGLONG) );
      flgarray = (char *) calloc((size_t) nelem, sizeof(char) );
      dwidth = 20;  /* max width of displayed long long integer value */

      if (ffgcfjj(fptr, colnum, firstrow, firstelem, nelem,
            llarray, flgarray, anynul, status) > 0)
      {
         free(flgarray);
         free(llarray);
         return(*status);
      }

      /* write the formated string for each value */
      if (nulval) {
          strncpy(tmpnull, nulval,79);
          tmpnull[79]='\0'; /* In case len(nulval) >= 79 */
          nulwidth = strlen(tmpnull);
      } else {
          strcpy(tmpnull, " ");
          nulwidth = 1;
      }

      for (ii = 0; ii < nelem; ii++)
      {
           if ( flgarray[ii] )
           {
              *array[ii] = '\0';
              if (dwidth < nulwidth)
                  strncat(array[ii], tmpnull, dwidth);
              else
                  sprintf(array[ii],"%*s",dwidth,tmpnull);
		  
              if (nultyp == 2)
	          nularray[ii] = 1;
           }
           else
           {	   

#if defined(_MSC_VER)
    /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
        snprintf(tmpstr, 400,"%20I64d", llarray[ii]);
#elif (USE_LL_SUFFIX == 1)
        snprintf(tmpstr, 400,"%20lld", llarray[ii]);
#else
        snprintf(tmpstr, 400,"%20ld", llarray[ii]);
#endif
              *array[ii] = '\0';
              strncat(array[ii], tmpstr, 20);
           }
      }

      free(flgarray);
      free(llarray);  /* free the memory */

    }
    else if (tcode == TLONGLONG && equivtype == TULONGLONG)
    {
      /* allocate memory for the array of ULONGLONG values */
      ullarray = (ULONGLONG *) calloc((size_t) nelem, sizeof(ULONGLONG) );
      flgarray = (char *) calloc((size_t) nelem, sizeof(char) );
      dwidth = 20;  /* max width of displayed unsigned long long integer value */

      if (ffgcfujj(fptr, colnum, firstrow, firstelem, nelem,
            ullarray, flgarray, anynul, status) > 0)
      {
         free(flgarray);
         free(ullarray);
         return(*status);
      }

      /* write the formated string for each value */
      if (nulval) {
          strncpy(tmpnull, nulval, 79);
          tmpnull[79]='\0'; /* In case len(nulval) >= 79 */
          nulwidth = strlen(tmpnull);
      } else {
          strcpy(tmpnull, " ");
          nulwidth = 1;
      }

      for (ii = 0; ii < nelem; ii++)
      {
           if ( flgarray[ii] )
           {
              *array[ii] = '\0';
              if (dwidth < nulwidth)
                  strncat(array[ii], tmpnull, dwidth);
              else
                  sprintf(array[ii],"%*s",dwidth,tmpnull);
		  
              if (nultyp == 2)
	          nularray[ii] = 1;
           }
           else
           {	   

#if defined(_MSC_VER)
    /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
        snprintf(tmpstr, 400, "%20I64u", ullarray[ii]); 
#elif (USE_LL_SUFFIX == 1)
        snprintf(tmpstr, 400, "%20llu", ullarray[ii]);
#else
        snprintf(tmpstr, 400, "%20lu", ullarray[ii]);
#endif
              *array[ii] = '\0';
              strncat(array[ii], tmpstr, 20);
           }
      }

      free(flgarray);
      free(ullarray);  /* free the memory */

    }
    else
    {
      /* allocate memory for the array of double values */
      darray = (double *) calloc((size_t) nelem, sizeof(double) );
      
      /* read all other numeric type columns as doubles */
      if (ffgcld(fptr, colnum, firstrow, firstelem, nelem, 1, nultyp, 
           DOUBLENULLVALUE, darray, nularray, anynul, status) > 0)
      {
         free(darray);
         return(*status);
      }

      /* determine the format for the output strings */

      ffgcdw(fptr, colnum, &dwidth, status);

      /* check if  column is scaled */
      ffkeyn("TSCAL", colnum, keyname, status);
      tstatus = 0;
      scaled = 0;
      if (ffgkyd(fptr, keyname, &tscale, NULL, &tstatus) == 0)
      {
            if (tscale != 1.0)
                scaled = 1;    /* yes, this is a scaled column */
      }

      intcol = 0;
      if (tcode <= TLONG && !scaled)
             intcol = 1;   /* this is an unscaled integer column */

      /* use the TDISPn keyword if it exists */
      ffkeyn("TDISP", colnum, keyname, status);
      tstatus = 0;
      cform[0] = '\0';

      if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
      {
           /* convert the Fortran style TDISPn to a C style format */
           ffcdsp(dispfmt, cform);

	   /* Special case: TDISPn='Aw' disallowed for numeric types */
	   if (dispfmt[0] == 'A') {
	     cform[0] = 0;

	   /* Special case: if the output is intended to be represented
	      as an integer, but we read it as a double, we need to
	      set intcol = 1 so it is printed as an integer */
	   } else if ((dispfmt[0] == 'I') || (dispfmt[0] == 'i') ||
		      (dispfmt[0] == 'O') || (dispfmt[0] == 'o') ||
		      (dispfmt[0] == 'Z') || (dispfmt[0] == 'z')) {
	     intcol = 1;
	   }
      }

      if (!cform[0])
      {
            /* no TDISPn keyword; use TFORMn instead */

            ffkeyn("TFORM", colnum, keyname, status);
            ffgkys(fptr, keyname, dispfmt, NULL, status);

            if (scaled && tcode <= TSHORT)
            {
                  /* scaled short integer column == float */
                  strcpy(cform, "%#14.6G");
            }
            else if (scaled && tcode == TLONG)
            {
                  /* scaled long integer column == double */
                  strcpy(cform, "%#23.15G");
            }
            else if (scaled && tcode == TLONGLONG)
            {
                  /* scaled long long integer column == double */
                  strcpy(cform, "%#23.15G");
            }
            else
            {
               ffghdt(fptr, &hdutype, status);
               if (hdutype == ASCII_TBL)
               {
                  /* convert the Fortran style TFORMn to a C style format */
                  ffcdsp(dispfmt, cform);
               }
               else
               {
                 /* this is a binary table, need to convert the format */
                  if (tcode == TBIT) {            /* 'X' */
                     strcpy(cform, "%4d");
                  } else if (tcode == TBYTE) {    /* 'B' */
                     strcpy(cform, "%4d");
                  } else if (tcode == TSHORT) {   /* 'I' */
                     strcpy(cform, "%6d");
                  } else if (tcode == TLONG) {    /* 'J' */
                     strcpy(cform, "%11.0f");
                     intcol = 0;  /* needed to support unsigned int */
                  } else if (tcode == TFLOAT) {   /* 'E' */
                     strcpy(cform, "%#14.6G");
                  } else if (tcode == TDOUBLE) {  /* 'D' */
                     strcpy(cform, "%#23.15G");
                  }
               }
            }
      } 

      if (nulval) {
          strncpy(tmpnull, nulval,79);
          tmpnull[79]='\0';
          nulwidth = strlen(tmpnull);
      } else {
          strcpy(tmpnull, " ");
          nulwidth = 1;
      }

      /* write the formated string for each value */
      for (ii = 0; ii < nelem; ii++)
      {
           if (tcode == TBIT)
           {
               byteval = (unsigned char) darray[ii];

               for (ll=0; ll < 8; ll++)
               {
                   if ( ((unsigned char) (byteval << ll)) >> 7 )
                       *(array[ii] + ll) = '1';
                   else
                       *(array[ii] + ll) = '0';
               }
               *(array[ii] + 8) = '\0';
           }
           /* test for null value */
           else if ( (nultyp == 1 && darray[ii] == DOUBLENULLVALUE) ||
                (nultyp == 2 && nularray[ii]) )
           {
              *array[ii] = '\0';
              if (dwidth < nulwidth)
                  strncat(array[ii], tmpnull, dwidth);
              else
                  sprintf(array[ii],"%*s",dwidth,tmpnull);
           }
           else
           {	   
              if (intcol) {
                snprintf(tmpstr, 400,cform, (int) darray[ii]);
              } else {
                snprintf(tmpstr, 400,cform, darray[ii]);
              }
	      
              /* fill field with '*' if number is too wide */
              dlen = strlen(tmpstr);
	      if (dlen > dwidth) {
	         memset(tmpstr, '*', dwidth);
              }

              *array[ii] = '\0';
              strncat(array[ii], tmpstr, dwidth);
           }
      }

      free(darray);  /* free the memory */
    }
    return(*status);
}